

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_client_transporter.cpp
# Opt level: O2

bool __thiscall
PipelineClientTransporter::Connect(PipelineClientTransporter *this,string *name,string *err)

{
  bool bVar1;
  uv_connect_t *req;
  string fullName;
  size_t len;
  unique_lock<std::mutex> lock;
  
  fullName._M_dataplus._M_p = (pointer)&fullName.field_2;
  fullName._M_string_length = 0;
  fullName.field_2._M_local_buf[0] = '\0';
  len = 0x800;
  uv_os_tmpdir((char *)&lock,&len);
  std::__cxx11::string::assign((char *)&fullName);
  std::__cxx11::string::append((char *)&fullName);
  std::__cxx11::string::append((string *)&fullName);
  (this->uvClient).data = this;
  req = (uv_connect_t *)malloc(0x60);
  req->data = this;
  uv_pipe_init((this->super_Transporter).loop,&this->uvClient,0);
  uv_pipe_connect(req,&this->uvClient,fullName._M_dataplus._M_p,onPipeConnectionCB);
  Transporter::StartEventLoop(&this->super_Transporter);
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->mutex);
  std::condition_variable::wait((unique_lock *)&this->cv);
  bVar1 = Transporter::IsConnected(&this->super_Transporter);
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  std::__cxx11::string::~string((string *)&fullName);
  return bVar1;
}

Assistant:

bool PipelineClientTransporter::Connect(const std::string& name, std::string& err) {
	std::string fullName;
#ifdef _WIN32
	{
		fullName = "\\\\.\\pipe\\emmylua-";
		fullName.append(name);
	}
#else
	{
		char tmp[2048];
		size_t len = sizeof(tmp);
		uv_os_tmpdir(tmp, &len);
		fullName = tmp;
		fullName.append("/");
		fullName.append(name);
	}
#endif

	uvClient.data = this;
	const auto req = (uv_connect_t*)malloc(sizeof(uv_connect_t));
	req->data = this;
	uv_pipe_init(loop, &uvClient, 0);
	uv_pipe_connect(req, &uvClient, fullName.c_str(), onPipeConnectionCB);
	StartEventLoop();

	std::unique_lock<std::mutex> lock(mutex);
	cv.wait(lock);
	return IsConnected();
}